

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O0

Am_Drawonable * get_safe_drawonable(Am_Object *screen)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Ptr pvVar3;
  Am_Drawonable *local_30;
  Am_Drawonable *drawonable;
  Am_Object local_18;
  Am_Object used_screen;
  Am_Object *screen_local;
  
  used_screen.data = (Am_Object_Data *)screen;
  Am_Object::Am_Object(&local_18);
  bVar1 = Am_Object::Valid((Am_Object *)used_screen.data);
  if (bVar1) {
    Am_Object::operator=(&local_18,(Am_Object *)used_screen.data);
  }
  else {
    Am_Object::operator=(&local_18,&Am_Screen);
  }
  pAVar2 = Am_Object::Get(&local_18,0x7d2,4);
  pvVar3 = Am_Value::operator_cast_to_void_(pAVar2);
  local_30 = Am_Drawonable::Narrow(pvVar3);
  if (local_30 == (Am_Drawonable *)0x0) {
    pAVar2 = Am_Object::Get(&Am_Screen,0x7d2,4);
    pvVar3 = Am_Value::operator_cast_to_void_(pAVar2);
    local_30 = Am_Drawonable::Narrow(pvVar3);
  }
  Am_Object::~Am_Object(&local_18);
  return local_30;
}

Assistant:

static Am_Drawonable *
get_safe_drawonable(const Am_Object &screen)
{
  Am_Object used_screen;
  if (screen.Valid())
    used_screen = screen;
  else
    used_screen = Am_Screen;

  Am_Drawonable *drawonable =
      Am_Drawonable::Narrow(used_screen.Get(Am_DRAWONABLE, Am_NO_DEPENDENCY));
  if (!drawonable)
    drawonable =
        Am_Drawonable::Narrow(Am_Screen.Get(Am_DRAWONABLE, Am_NO_DEPENDENCY));
  return drawonable;
}